

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
bwtil::IndexedBWT::convertToTextCoordinates
          (IndexedBWT *this,pair<unsigned_long,_unsigned_long> interval)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ulong in_RCX;
  uint in_EDX;
  ulint in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  uint i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *coord;
  value_type *in_stack_ffffffffffffff98;
  IndexedBWT *in_stack_ffffffffffffffc0;
  undefined4 local_28;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x171359);
  for (local_28 = in_EDX; local_28 < in_RCX; local_28 = local_28 + 1) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              convertToTextCoordinate(in_stack_ffffffffffffffc0,in_RSI);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_00,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

vector<ulint> convertToTextCoordinates(pair<ulint, ulint> interval){

		vector<ulint> coord;
		for(uint i=interval.first;i<interval.second;i++)
			coord.push_back( convertToTextCoordinate(i) );

		return coord;

	}